

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O2

QTransform * __thiscall
QTransform::inverted(QTransform *__return_storage_ptr__,QTransform *this,bool *invertible)

{
  double dVar1;
  double dVar2;
  long lVar3;
  TransformationType TVar4;
  long lVar5;
  bool bVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  qreal *pqVar9;
  QTransform *pQVar10;
  long in_FS_OFFSET;
  byte bVar11;
  ulong uVar12;
  qreal qVar13;
  undefined1 auVar14 [16];
  QTransform t;
  
  bVar11 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar7 = (qreal *)&DAT_005f1f70;
  pqVar9 = (qreal *)__return_storage_ptr__;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pqVar9 = *pqVar7;
    pqVar7 = pqVar7 + 1;
    pqVar9 = pqVar9 + 1;
  }
  pqVar7 = (qreal *)&DAT_005f1fc0;
  pqVar9 = (qreal *)__return_storage_ptr__;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pqVar9 = *pqVar7;
    pqVar7 = pqVar7 + 1;
    pqVar9 = pqVar9 + 1;
  }
  *(undefined2 *)&__return_storage_ptr__->field_0x48 = 0xa800;
  TVar4 = inline_type(this);
  bVar6 = true;
  if (TVar4 != TxNone) {
    if (TVar4 == TxScale) {
      dVar1 = this->m_matrix[0][0];
      uVar12 = -(ulong)(dVar1 < -dVar1);
      bVar6 = false;
      if (((double)(~uVar12 & (ulong)dVar1 | (ulong)-dVar1 & uVar12) <= 1e-12) ||
         (dVar2 = this->m_matrix[1][1], uVar12 = -(ulong)(dVar2 < -dVar2), bVar6 = false,
         (double)(~uVar12 & (ulong)dVar2 | (ulong)-dVar2 & uVar12) <= 1e-12)) goto LAB_003dad3b;
      auVar14._8_8_ = dVar2;
      auVar14._0_8_ = dVar1;
      auVar14 = divpd(_DAT_005c7e40,auVar14);
      __return_storage_ptr__->m_matrix[0][0] = auVar14._0_8_;
      __return_storage_ptr__->m_matrix[1][1] = auVar14._8_8_;
      dVar1 = this->m_matrix[2][1];
      __return_storage_ptr__->m_matrix[2][0] = -this->m_matrix[2][0] * auVar14._0_8_;
      __return_storage_ptr__->m_matrix[2][1] = -dVar1 * auVar14._8_8_;
    }
    else {
      if (TVar4 != TxTranslate) {
        qVar13 = determinant(this);
        uVar12 = -(ulong)(qVar13 < -qVar13);
        if ((double)(~uVar12 & (ulong)qVar13 | (ulong)-qVar13 & uVar12) <= 1e-12) {
          bVar6 = false;
        }
        else {
          adjoint(this);
          operator/=(&t,qVar13);
          pQVar8 = &t;
          pQVar10 = __return_storage_ptr__;
          for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
            *(undefined1 *)pQVar10->m_matrix[0] = *(undefined1 *)pQVar8->m_matrix[0];
            pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar11 * -2 + 1);
            pQVar10 = (QTransform *)((long)pQVar10 + (ulong)bVar11 * -2 + 1);
          }
        }
        goto LAB_003dad3b;
      }
      qVar13 = this->m_matrix[2][1];
      __return_storage_ptr__->m_matrix[2][0] = -this->m_matrix[2][0];
      __return_storage_ptr__->m_matrix[2][1] = -qVar13;
    }
    bVar6 = true;
  }
LAB_003dad3b:
  if (invertible != (bool *)0x0) {
    *invertible = bVar6;
  }
  if (bVar6 != false) {
    *(ushort *)&__return_storage_ptr__->field_0x48 =
         *(ushort *)&this->field_0x48 & 0x3ff |
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x48 & 0xfc00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform QTransform::inverted(bool *invertible) const
{
    QTransform invert;
    bool inv = true;

    switch(inline_type()) {
    case TxNone:
        break;
    case TxTranslate:
        invert.m_matrix[2][0] = -m_matrix[2][0];
        invert.m_matrix[2][1] = -m_matrix[2][1];
        break;
    case TxScale:
        inv = !qFuzzyIsNull(m_matrix[0][0]);
        inv &= !qFuzzyIsNull(m_matrix[1][1]);
        if (inv) {
            invert.m_matrix[0][0] = 1. / m_matrix[0][0];
            invert.m_matrix[1][1] = 1. / m_matrix[1][1];
            invert.m_matrix[2][0] = -m_matrix[2][0] * invert.m_matrix[0][0];
            invert.m_matrix[2][1] = -m_matrix[2][1] * invert.m_matrix[1][1];
        }
        break;
    default:
        // general case
        qreal det = determinant();
        inv = !qFuzzyIsNull(det);
        if (inv)
            invert = adjoint() / det;
        break;
    }

    if (invertible)
        *invertible = inv;

    if (inv) {
        // inverting doesn't change the type
        invert.m_type = m_type;
        invert.m_dirty = m_dirty;
    }

    return invert;
}